

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::init(ShaderAtomicOpCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s;
  RenderContext *pRVar6;
  char *pcVar7;
  ostream *poVar8;
  ShaderProgram *pSVar9;
  ProgramSources *sources;
  TestLog *log;
  TestError *this_00;
  bool bVar10;
  DataType local_37c;
  allocator<char> local_369;
  string local_368;
  undefined1 local_341;
  string local_340;
  ShaderSource local_320;
  ProgramSources local_2f8;
  deUint64 local_228;
  char *local_220;
  char *castEnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string castBeg;
  undefined1 local_1b8 [8];
  ostringstream src;
  deUint32 numValues;
  char *outTypeName;
  DataType outType;
  char *typeName;
  char *precName;
  bool isSSBO;
  ShaderAtomicOpCase *this_local;
  
  bVar10 = this->m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
  pcVar4 = glu::getPrecisionName(this->m_precision);
  pcVar5 = glu::getDataTypeName(this->m_type);
  if (bVar10) {
    local_37c = this->m_type;
  }
  else {
    local_37c = TYPE_UINT;
  }
  __s = glu::getDataTypeName(local_37c);
  uVar1 = product<unsigned_int,3>(&this->m_workGroupSize);
  uVar2 = product<unsigned_int,3>(&this->m_numWorkGroups);
  src._372_4_ = uVar1 * uVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar7 = glu::getGLSLVersionDeclaration(version);
  poVar8 = std::operator<<((ostream *)local_1b8,pcVar7);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"layout(local_size_x = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::x(&this->m_workGroupSize);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  poVar8 = std::operator<<(poVar8,", local_size_y = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y(&this->m_workGroupSize);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  poVar8 = std::operator<<(poVar8,", local_size_z = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z(&this->m_workGroupSize);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  poVar8 = std::operator<<(poVar8,") in;\n");
  poVar8 = std::operator<<(poVar8,"layout(binding = 0) buffer InOut\n");
  poVar8 = std::operator<<(poVar8,"{\n");
  poVar8 = std::operator<<(poVar8,"\t");
  poVar8 = std::operator<<(poVar8,pcVar4);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar5);
  poVar8 = std::operator<<(poVar8," inputValues[");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,src._372_4_);
  poVar8 = std::operator<<(poVar8,"];\n");
  poVar8 = std::operator<<(poVar8,"\t");
  poVar8 = std::operator<<(poVar8,pcVar4);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,__s);
  poVar8 = std::operator<<(poVar8," outputValues[");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,src._372_4_);
  poVar8 = std::operator<<(poVar8,"];\n");
  poVar8 = std::operator<<(poVar8,"\t");
  pcVar7 = "";
  if (bVar10) {
    pcVar7 = "coherent ";
  }
  poVar8 = std::operator<<(poVar8,pcVar7);
  poVar8 = std::operator<<(poVar8,pcVar4);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,__s);
  poVar8 = std::operator<<(poVar8," groupValues[");
  uVar1 = product<unsigned_int,3>(&this->m_numWorkGroups);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
  poVar8 = std::operator<<(poVar8,"];\n");
  std::operator<<(poVar8,"} sb_inout;\n");
  if (!bVar10) {
    poVar8 = std::operator<<((ostream *)local_1b8,"shared ");
    poVar8 = std::operator<<(poVar8,pcVar4);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    std::operator<<(poVar8," s_var;\n");
  }
  poVar8 = std::operator<<((ostream *)local_1b8,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  poVar8 = std::operator<<(poVar8,"{\n");
  poVar8 = std::operator<<(poVar8,
                           "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar8 = std::operator<<(poVar8,
                           "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar8 = std::operator<<(poVar8,"\tuint globalOffs = localSize*globalNdx;\n");
  poVar8 = std::operator<<(poVar8,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n");
  std::operator<<(poVar8,"\n");
  if (bVar10) {
    poVar8 = std::operator<<((ostream *)local_1b8,"\tsb_inout.outputValues[offset] = ");
    poVar8 = std::operator<<(poVar8,(string *)&this->m_funcName);
    std::operator<<(poVar8,"(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n");
  }
  else {
    castEnd._6_1_ = 0;
    castEnd._5_1_ = 0;
    castEnd._3_1_ = 0;
    if (local_37c == this->m_type) {
      std::allocator<char>::allocator();
      castEnd._3_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1f0,"",(allocator<char> *)((long)&castEnd + 4));
    }
    else {
      std::allocator<char>::allocator();
      castEnd._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,__s,(allocator<char> *)((long)&castEnd + 7));
      castEnd._5_1_ = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     &local_210,"(");
    }
    if ((castEnd._3_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&castEnd + 4));
    }
    if ((castEnd._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_210);
    }
    if ((castEnd._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&castEnd + 7));
    }
    local_220 = "";
    if (local_37c != this->m_type) {
      local_220 = ")";
    }
    poVar8 = std::operator<<((ostream *)local_1b8,"\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar8 = std::operator<<(poVar8,"\t\ts_var = ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    poVar8 = std::operator<<(poVar8,"(");
    local_228 = (deUint64)tcu::toHex<unsigned_int>(this->m_initialValue);
    poVar8 = tcu::Format::operator<<(poVar8,(Hex<8UL>)local_228);
    poVar8 = std::operator<<(poVar8,"u);\n");
    poVar8 = std::operator<<(poVar8,"\tbarrier();\n");
    poVar8 = std::operator<<(poVar8,"\t");
    poVar8 = std::operator<<(poVar8,pcVar4);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar5);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)&this->m_funcName);
    poVar8 = std::operator<<(poVar8,"(s_var, sb_inout.inputValues[offset]);\n");
    poVar8 = std::operator<<(poVar8,"\tsb_inout.outputValues[offset] = ");
    poVar8 = std::operator<<(poVar8,(string *)local_1f0);
    poVar8 = std::operator<<(poVar8,"res");
    poVar8 = std::operator<<(poVar8,local_220);
    poVar8 = std::operator<<(poVar8,";\n");
    poVar8 = std::operator<<(poVar8,"\tbarrier();\n");
    poVar8 = std::operator<<(poVar8,"\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar8 = std::operator<<(poVar8,"\t\tsb_inout.groupValues[globalNdx] = ");
    poVar8 = std::operator<<(poVar8,(string *)local_1f0);
    poVar8 = std::operator<<(poVar8,"s_var");
    poVar8 = std::operator<<(poVar8,local_220);
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::~string((string *)local_1f0);
  }
  std::operator<<((ostream *)local_1b8,"}\n");
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  local_341 = 1;
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2f8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_320,&local_340);
  sources = glu::ProgramSources::operator<<(&local_2f8,&local_320);
  glu::ShaderProgram::ShaderProgram(pSVar9,pRVar6,sources);
  local_341 = 0;
  this->m_program = pSVar9;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  glu::ProgramSources::~ProgramSources(&local_2f8);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_program);
  bVar10 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar10) {
    iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    return iVar3;
  }
  pSVar9 = this->m_program;
  if (pSVar9 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar9);
    operator_delete(pSVar9,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"Compile failed",&local_369);
  tcu::TestError::TestError(this_00,&local_368);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ShaderAtomicOpCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);

	const DataType		outType		= isSSBO ? m_type : glu::TYPE_UINT;
	const char*			outTypeName	= getDataTypeName(outType);

	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(getContextTypeGLSLVersion(m_context.getRenderContext().getType())) << "\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " inputValues[" << numValues << "];\n"
		<< "	" << precName << " " << outTypeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << outTypeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (isSSBO)
	{
		DE_ASSERT(outType == m_type);
		src << "	sb_inout.outputValues[offset] = " << m_funcName << "(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n";
	}
	else
	{
		const string		castBeg	= outType != m_type ? (string(outTypeName) + "(") : string("");
		const char* const	castEnd	= outType != m_type ? ")" : "";

		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << tcu::toHex(m_initialValue) << "u);\n"
			<< "	barrier();\n"
			<< "	" << precName << " " << typeName << " res = " << m_funcName << "(s_var, sb_inout.inputValues[offset]);\n"
			<< "	sb_inout.outputValues[offset] = " << castBeg << "res" << castEnd << ";\n"
			<< "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = " << castBeg << "s_var" << castEnd << ";\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}